

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-inl.h
# Opt level: O0

bool spdlog::details::os::path_exists(filename_t *filename)

{
  char *__file;
  int iVar1;
  stat buffer;
  stat sStack_98;
  
  __file = (char *)std::__cxx11::string::c_str();
  iVar1 = stat(__file,&sStack_98);
  return iVar1 == 0;
}

Assistant:

SPDLOG_INLINE bool path_exists(const filename_t &filename) SPDLOG_NOEXCEPT
{
#ifdef _WIN32
#ifdef SPDLOG_WCHAR_FILENAMES
    auto attribs = ::GetFileAttributesW(filename.c_str());
#else
    auto attribs = ::GetFileAttributesA(filename.c_str());
#endif
    return attribs != INVALID_FILE_ATTRIBUTES;
#else // common linux/unix all have the stat system call
    struct stat buffer;
    return (::stat(filename.c_str(), &buffer) == 0);
#endif
}